

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.c
# Opt level: O0

xmlChar * xmlSplitQName(xmlParserCtxtPtr ctxt,xmlChar *name,xmlChar **prefix)

{
  byte bVar1;
  bool bVar2;
  int iVar3;
  xmlChar *pxVar4;
  xmlChar *tmp_1;
  int first;
  int l;
  xmlChar *tmp;
  byte *pbStack_b8;
  int c;
  xmlChar *cur;
  xmlChar *ret;
  int max;
  int len;
  xmlChar *buffer;
  xmlChar buf [105];
  xmlChar **prefix_local;
  xmlChar *name_local;
  xmlParserCtxtPtr ctxt_local;
  
  _max = (xmlChar *)0x0;
  ret._4_4_ = 0;
  ret._0_4_ = 100;
  cur = (xmlChar *)0x0;
  if (prefix == (xmlChar **)0x0) {
    return (xmlChar *)0x0;
  }
  *prefix = (xmlChar *)0x0;
  if (name == (xmlChar *)0x0) {
    return (xmlChar *)0x0;
  }
  unique0x10000426 = prefix;
  if (*name == ':') {
    pbStack_b8 = name;
    pxVar4 = xmlStrdup(name);
    return pxVar4;
  }
  bVar1 = *name;
  pbStack_b8 = name + 1;
  while( true ) {
    tmp._4_4_ = (uint)bVar1;
    bVar2 = false;
    if ((tmp._4_4_ != 0) && (bVar2 = false, tmp._4_4_ != 0x3a)) {
      bVar2 = ret._4_4_ < 100;
    }
    if (!bVar2) break;
    buf[(long)ret._4_4_ + -8] = bVar1;
    bVar1 = *pbStack_b8;
    pbStack_b8 = pbStack_b8 + 1;
    ret._4_4_ = ret._4_4_ + 1;
  }
  if (99 < ret._4_4_) {
    ret._0_4_ = ret._4_4_ << 1;
    _max = (xmlChar *)(*xmlMallocAtomic)((long)(int)ret);
    if (_max == (xmlChar *)0x0) {
      xmlErrMemory(ctxt,(char *)0x0);
      return (xmlChar *)0x0;
    }
    memcpy(_max,&buffer,(long)ret._4_4_);
    while (tmp._4_4_ != 0 && tmp._4_4_ != 0x3a) {
      pxVar4 = _max;
      if ((int)ret < ret._4_4_ + 10) {
        ret._0_4_ = (int)ret << 1;
        _first = (xmlChar *)(*xmlRealloc)(_max,(long)(int)ret);
        pxVar4 = _first;
        if (_first == (xmlChar *)0x0) {
          (*xmlFree)(_max);
          xmlErrMemory(ctxt,(char *)0x0);
          return (xmlChar *)0x0;
        }
      }
      _max = pxVar4;
      _max[ret._4_4_] = (xmlChar)tmp._4_4_;
      tmp._4_4_ = (uint)*pbStack_b8;
      pbStack_b8 = pbStack_b8 + 1;
      ret._4_4_ = ret._4_4_ + 1;
    }
    _max[ret._4_4_] = '\0';
  }
  if ((tmp._4_4_ == 0x3a) && (*pbStack_b8 == 0)) {
    if (_max != (xmlChar *)0x0) {
      (*xmlFree)(_max);
    }
    *stack0xffffffffffffffd8 = (xmlChar *)0x0;
    pxVar4 = xmlStrdup(name);
    return pxVar4;
  }
  if (_max == (xmlChar *)0x0) {
    cur = xmlStrndup((xmlChar *)&buffer,ret._4_4_);
  }
  else {
    cur = _max;
    _max = (xmlChar *)0x0;
    ret._0_4_ = 100;
  }
  if (tmp._4_4_ != 0x3a) {
    return cur;
  }
  tmp._4_4_ = (uint)*pbStack_b8;
  *stack0xffffffffffffffd8 = cur;
  if (tmp._4_4_ == 0) {
    pxVar4 = xmlStrndup("",0);
    return pxVar4;
  }
  ret._4_4_ = 0;
  if ((((tmp._4_4_ < 0x61) || (0x7a < tmp._4_4_)) && ((tmp._4_4_ < 0x41 || (0x5a < tmp._4_4_)))) &&
     ((tmp._4_4_ != 0x5f && (tmp._4_4_ != 0x3a)))) {
    tmp_1._0_4_ = xmlStringCurrentChar(ctxt,pbStack_b8,(int *)((long)&tmp_1 + 4));
    if ((int)(uint)tmp_1 < 0x100) {
      if (((((0x40 < (int)(uint)tmp_1) && ((int)(uint)tmp_1 < 0x5b)) ||
           ((0x60 < (int)(uint)tmp_1 && ((int)(uint)tmp_1 < 0x7b)))) ||
          (((0xbf < (int)(uint)tmp_1 && ((int)(uint)tmp_1 < 0xd7)) ||
           ((0xd7 < (int)(uint)tmp_1 && ((int)(uint)tmp_1 < 0xf7)))))) || (0xf7 < (int)(uint)tmp_1))
      goto LAB_0016fb83;
    }
    else {
      iVar3 = xmlCharInRange((uint)tmp_1,&xmlIsBaseCharGroup);
      if (iVar3 != 0) goto LAB_0016fb83;
    }
    if ((((int)(uint)tmp_1 < 0x100) ||
        (((((int)(uint)tmp_1 < 0x4e00 || (0x9fa5 < (int)(uint)tmp_1)) && ((uint)tmp_1 != 0x3007)) &&
         (((int)(uint)tmp_1 < 0x3021 || (0x3029 < (int)(uint)tmp_1)))))) && ((uint)tmp_1 != 0x5f)) {
      xmlFatalErrMsgStr(ctxt,XML_NS_ERR_QNAME,"Name %s is not XML Namespace compliant\n",name);
    }
  }
LAB_0016fb83:
  while (pbStack_b8 = pbStack_b8 + 1, tmp._4_4_ != 0 && ret._4_4_ < (int)ret) {
    buf[(long)ret._4_4_ + -8] = (xmlChar)tmp._4_4_;
    ret._4_4_ = ret._4_4_ + 1;
    tmp._4_4_ = (uint)*pbStack_b8;
  }
  if ((int)ret <= ret._4_4_) {
    ret._0_4_ = ret._4_4_ << 1;
    _max = (xmlChar *)(*xmlMallocAtomic)((long)(int)ret);
    if (_max == (xmlChar *)0x0) {
      xmlErrMemory(ctxt,(char *)0x0);
      return (xmlChar *)0x0;
    }
    memcpy(_max,&buffer,(long)ret._4_4_);
    while (tmp._4_4_ != 0) {
      pxVar4 = _max;
      if ((int)ret < ret._4_4_ + 10) {
        ret._0_4_ = (int)ret << 1;
        pxVar4 = (xmlChar *)(*xmlRealloc)(_max,(long)(int)ret);
        if (pxVar4 == (xmlChar *)0x0) {
          xmlErrMemory(ctxt,(char *)0x0);
          (*xmlFree)(_max);
          return (xmlChar *)0x0;
        }
      }
      _max = pxVar4;
      _max[ret._4_4_] = (xmlChar)tmp._4_4_;
      tmp._4_4_ = (uint)*pbStack_b8;
      pbStack_b8 = pbStack_b8 + 1;
      ret._4_4_ = ret._4_4_ + 1;
    }
    _max[ret._4_4_] = '\0';
  }
  if (_max == (xmlChar *)0x0) {
    cur = xmlStrndup((xmlChar *)&buffer,ret._4_4_);
  }
  else {
    cur = _max;
  }
  return cur;
}

Assistant:

xmlChar *
xmlSplitQName(xmlParserCtxtPtr ctxt, const xmlChar *name, xmlChar **prefix) {
    xmlChar buf[XML_MAX_NAMELEN + 5];
    xmlChar *buffer = NULL;
    int len = 0;
    int max = XML_MAX_NAMELEN;
    xmlChar *ret = NULL;
    const xmlChar *cur = name;
    int c;

    if (prefix == NULL) return(NULL);
    *prefix = NULL;

    if (cur == NULL) return(NULL);

#ifndef XML_XML_NAMESPACE
    /* xml: prefix is not really a namespace */
    if ((cur[0] == 'x') && (cur[1] == 'm') &&
        (cur[2] == 'l') && (cur[3] == ':'))
	return(xmlStrdup(name));
#endif

    /* nasty but well=formed */
    if (cur[0] == ':')
	return(xmlStrdup(name));

    c = *cur++;
    while ((c != 0) && (c != ':') && (len < max)) { /* tested bigname.xml */
	buf[len++] = c;
	c = *cur++;
    }
    if (len >= max) {
	/*
	 * Okay someone managed to make a huge name, so he's ready to pay
	 * for the processing speed.
	 */
	max = len * 2;

	buffer = (xmlChar *) xmlMallocAtomic(max);
	if (buffer == NULL) {
	    xmlErrMemory(ctxt, NULL);
	    return(NULL);
	}
	memcpy(buffer, buf, len);
	while ((c != 0) && (c != ':')) { /* tested bigname.xml */
	    if (len + 10 > max) {
	        xmlChar *tmp;

		max *= 2;
		tmp = (xmlChar *) xmlRealloc(buffer, max);
		if (tmp == NULL) {
		    xmlFree(buffer);
		    xmlErrMemory(ctxt, NULL);
		    return(NULL);
		}
		buffer = tmp;
	    }
	    buffer[len++] = c;
	    c = *cur++;
	}
	buffer[len] = 0;
    }

    if ((c == ':') && (*cur == 0)) {
        if (buffer != NULL)
	    xmlFree(buffer);
	*prefix = NULL;
	return(xmlStrdup(name));
    }

    if (buffer == NULL)
	ret = xmlStrndup(buf, len);
    else {
	ret = buffer;
	buffer = NULL;
	max = XML_MAX_NAMELEN;
    }


    if (c == ':') {
	c = *cur;
        *prefix = ret;
	if (c == 0) {
	    return(xmlStrndup(BAD_CAST "", 0));
	}
	len = 0;

	/*
	 * Check that the first character is proper to start
	 * a new name
	 */
	if (!(((c >= 0x61) && (c <= 0x7A)) ||
	      ((c >= 0x41) && (c <= 0x5A)) ||
	      (c == '_') || (c == ':'))) {
	    int l;
	    int first = CUR_SCHAR(cur, l);

	    if (!IS_LETTER(first) && (first != '_')) {
		xmlFatalErrMsgStr(ctxt, XML_NS_ERR_QNAME,
			    "Name %s is not XML Namespace compliant\n",
				  name);
	    }
	}
	cur++;

	while ((c != 0) && (len < max)) { /* tested bigname2.xml */
	    buf[len++] = c;
	    c = *cur++;
	}
	if (len >= max) {
	    /*
	     * Okay someone managed to make a huge name, so he's ready to pay
	     * for the processing speed.
	     */
	    max = len * 2;

	    buffer = (xmlChar *) xmlMallocAtomic(max);
	    if (buffer == NULL) {
	        xmlErrMemory(ctxt, NULL);
		return(NULL);
	    }
	    memcpy(buffer, buf, len);
	    while (c != 0) { /* tested bigname2.xml */
		if (len + 10 > max) {
		    xmlChar *tmp;

		    max *= 2;
		    tmp = (xmlChar *) xmlRealloc(buffer, max);
		    if (tmp == NULL) {
			xmlErrMemory(ctxt, NULL);
			xmlFree(buffer);
			return(NULL);
		    }
		    buffer = tmp;
		}
		buffer[len++] = c;
		c = *cur++;
	    }
	    buffer[len] = 0;
	}

	if (buffer == NULL)
	    ret = xmlStrndup(buf, len);
	else {
	    ret = buffer;
	}
    }

    return(ret);
}